

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

void * tro_tree_ctx_get_child(trt_tree_ctx *tc)

{
  void *pvVar1;
  trt_tree_ctx *tc_local;
  
  pvVar1 = tro_tree_ctx_get_node(tc);
  if (pvVar1 == (void *)0x0) {
    tc_local = (trt_tree_ctx *)0x0;
  }
  else if (tc->lysc_tree == '\0') {
    tc_local = (trt_tree_ctx *)lysp_node_child(tc->pn);
  }
  else {
    tc_local = (trt_tree_ctx *)lysc_node_child(tc->cn);
  }
  return tc_local;
}

Assistant:

static const void *
tro_tree_ctx_get_child(const struct trt_tree_ctx *tc)
{
    if (!tro_tree_ctx_get_node(tc)) {
        return NULL;
    }

    if (tc->lysc_tree) {
        return lysc_node_child(tc->cn);
    } else {
        return lysp_node_child(tc->pn);
    }
}